

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

void draw_rich_text_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  Am_Text_Viewing_Context vc;
  Am_Value value;
  
  pAVar5 = Am_Object::Get(self,100,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x66,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x67,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar5);
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Make_Unique(self,0x1ee);
  pAVar5 = Am_Object::Get(self,0x1ee,1);
  Am_Value::operator=(&value,pAVar5);
  if ((value.value.wrapper_value != (Am_Wrapper *)0x0) &&
     (value.type == Am_Text_Viewing_Context_Data::id)) {
    Am_Text_Viewing_Context::Am_Text_Viewing_Context(&vc,&value);
    if (vc.data != (Am_Text_Viewing_Context_Data *)0x0) {
      (*drawonable->_vptr_Am_Drawonable[0x21])
                (drawonable,(ulong)(uint)(iVar1 + x_offset),(ulong)(uint)(iVar2 + y_offset),
                 (ulong)uVar3,(ulong)uVar4);
      Am_Text_Viewing_Context_Data::Draw
                (vc.data,drawonable,(long)(iVar1 + x_offset),(long)(iVar2 + y_offset));
      (*drawonable->_vptr_Am_Drawonable[0x22])(drawonable);
      Am_Text_Viewing_Context::~Am_Text_Viewing_Context(&vc);
      Am_Value::~Am_Value(&value);
      return;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar6 = std::operator<<(poVar6,"Tried to draw an invalid Am_Text_Viewing_Context.");
    std::endl<char,std::char_traits<char>>(poVar6);
    Am_Error();
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar6 = std::operator<<(poVar6,
                           "The slot Am_TEXT_VIEWER does not contain an Am_Text_Viewing_Context.");
  std::endl<char,std::char_traits<char>>(poVar6);
  Am_Error();
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, draw_rich_text,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = self.Get(Am_LEFT);
  int top = self.Get(Am_TOP);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  Am_Value value;
  self.Make_Unique(Am_TEXT_VIEWER);
  value = self.Peek(Am_TEXT_VIEWER);

  if (!Am_Text_Viewing_Context::Test(value))
    Am_ERRORO(
        "The slot Am_TEXT_VIEWER does not contain an Am_Text_Viewing_Context.",
        self, Am_TEXT_VIEWER);

  Am_Text_Viewing_Context vc = value;
  if (vc.Valid()) {
    drawonable->Push_Clip(x_offset + left, y_offset + top, width, height);
    vc.Draw(drawonable, x_offset + left, y_offset + top);
    drawonable->Pop_Clip();
  } else
    Am_ERRORO("Tried to draw an invalid Am_Text_Viewing_Context.", self,
              Am_TEXT_VIEWER);
}